

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O0

void __thiscall QPDFCrypto_openssl::SHA2_init(QPDFCrypto_openssl *this,int bits)

{
  int iVar1;
  int bits_local;
  QPDFCrypto_openssl *this_local;
  
  if ((SHA2_init(int)::md == '\0') && (iVar1 = __cxa_guard_acquire(&SHA2_init(int)::md), iVar1 != 0)
     ) {
    SHA2_init::md = (EVP_MD *)EVP_sha512();
    __cxa_guard_release(&SHA2_init(int)::md);
  }
  if (bits == 0x100) {
    SHA2_init::md = (EVP_MD *)EVP_sha256();
  }
  else if (bits == 0x180) {
    SHA2_init::md = (EVP_MD *)EVP_sha384();
  }
  else {
    if (bits != 0x200) {
      bad_bits(bits);
      return;
    }
    SHA2_init::md = (EVP_MD *)EVP_sha512();
  }
  this->sha2_bits = (long)bits;
  iVar1 = EVP_MD_CTX_reset(this->md_ctx);
  check_openssl(iVar1);
  iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)this->md_ctx,(EVP_MD *)SHA2_init::md,(ENGINE *)0x0);
  check_openssl(iVar1);
  return;
}

Assistant:

void
QPDFCrypto_openssl::SHA2_init(int bits)
{
    static const EVP_MD* md = EVP_sha512();
    switch (bits) {
    case 256:
        md = EVP_sha256();
        break;
    case 384:
        md = EVP_sha384();
        break;
    case 512:
        md = EVP_sha512();
        break;
    default:
        bad_bits(bits);
        return;
    }
    sha2_bits = static_cast<size_t>(bits);
    check_openssl(EVP_MD_CTX_reset(md_ctx));
    check_openssl(EVP_DigestInit_ex(md_ctx, md, nullptr));
}